

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O3

void __thiscall
btHashMap<btHashString,_btCollisionObject_*>::insert
          (btHashMap<btHashString,_btCollisionObject_*> *this,btHashString *key,
          btCollisionObject **value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  btCollisionObject **ptr;
  btHashString *ptr_00;
  int *piVar6;
  undefined8 uVar7;
  uint uVar8;
  undefined4 uVar9;
  int iVar10;
  uint uVar11;
  btCollisionObject **ppbVar12;
  btHashString *pbVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  int sz;
  
  uVar16 = key->m_hash;
  iVar3 = (this->m_valueArray).m_capacity;
  iVar10 = findIndex(this,key);
  if (iVar10 == -1) {
    uVar4 = (this->m_valueArray).m_size;
    uVar5 = (this->m_valueArray).m_capacity;
    uVar11 = uVar4;
    if (uVar4 == uVar5) {
      iVar10 = 1;
      if (uVar4 != 0) {
        iVar10 = uVar4 * 2;
      }
      if ((int)uVar4 < iVar10) {
        if (iVar10 == 0) {
          ppbVar12 = (btCollisionObject **)0x0;
        }
        else {
          ppbVar12 = (btCollisionObject **)btAlignedAllocInternal((long)iVar10 << 3,0x10);
          uVar11 = (this->m_valueArray).m_size;
        }
        if (0 < (int)uVar11) {
          uVar15 = 0;
          do {
            ppbVar12[uVar15] = (this->m_valueArray).m_data[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
        ptr = (this->m_valueArray).m_data;
        if ((ptr != (btCollisionObject **)0x0) && ((this->m_valueArray).m_ownsMemory == true)) {
          btAlignedFreeInternal(ptr);
          uVar11 = (this->m_valueArray).m_size;
        }
        (this->m_valueArray).m_ownsMemory = true;
        (this->m_valueArray).m_data = ppbVar12;
        (this->m_valueArray).m_capacity = iVar10;
      }
    }
    (this->m_valueArray).m_data[(int)uVar11] = *value;
    (this->m_valueArray).m_size = uVar11 + 1;
    uVar11 = (this->m_keyArray).m_size;
    if (uVar11 == (this->m_keyArray).m_capacity) {
      iVar10 = 1;
      if (uVar11 != 0) {
        iVar10 = uVar11 * 2;
      }
      if ((int)uVar11 < iVar10) {
        if (iVar10 == 0) {
          pbVar13 = (btHashString *)0x0;
        }
        else {
          pbVar13 = (btHashString *)btAlignedAllocInternal((long)iVar10 << 4,0x10);
          uVar11 = (this->m_keyArray).m_size;
        }
        if (0 < (int)uVar11) {
          lVar14 = 0;
          do {
            puVar1 = (undefined8 *)((long)&((this->m_keyArray).m_data)->m_string + lVar14);
            uVar7 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pbVar13->m_string + lVar14);
            *puVar2 = *puVar1;
            puVar2[1] = uVar7;
            lVar14 = lVar14 + 0x10;
          } while ((ulong)uVar11 << 4 != lVar14);
        }
        ptr_00 = (this->m_keyArray).m_data;
        if ((ptr_00 != (btHashString *)0x0) && ((this->m_keyArray).m_ownsMemory == true)) {
          btAlignedFreeInternal(ptr_00);
        }
        (this->m_keyArray).m_ownsMemory = true;
        (this->m_keyArray).m_data = pbVar13;
        (this->m_keyArray).m_capacity = iVar10;
        uVar11 = (this->m_keyArray).m_size;
      }
    }
    uVar8 = key->m_hash;
    uVar9 = *(undefined4 *)&key->field_0xc;
    pbVar13 = (this->m_keyArray).m_data + (int)uVar11;
    pbVar13->m_string = key->m_string;
    pbVar13->m_hash = uVar8;
    *(undefined4 *)&pbVar13->field_0xc = uVar9;
    piVar6 = &(this->m_keyArray).m_size;
    *piVar6 = *piVar6 + 1;
    if ((int)uVar5 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      uVar16 = (this->m_valueArray).m_capacity - 1U & key->m_hash;
    }
    else {
      uVar16 = iVar3 - 1U & uVar16;
    }
    piVar6 = (this->m_hashTable).m_data;
    (this->m_next).m_data[(int)uVar4] = piVar6[(int)uVar16];
    piVar6[(int)uVar16] = uVar4;
  }
  else {
    (this->m_valueArray).m_data[iVar10] = *value;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value) {
		int hash = key.getHash() & (m_valueArray.capacity()-1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index]=value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity()-1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}